

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::MaybeBootstrap
               (Options *options,GeneratorContext *generator_context,bool bootstrap_flag,
               string *basename)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar4;
  undefined4 extraout_var_03;
  string sStack_128;
  Printer printer;
  string forward_to_basename;
  string bootstrap_basename;
  ZeroCopyOutputStream *pZVar3;
  undefined4 extraout_var_02;
  
  bootstrap_basename._M_dataplus._M_p = (pointer)&bootstrap_basename.field_2;
  bootstrap_basename._M_string_length = 0;
  bootstrap_basename.field_2._M_local_buf[0] = '\0';
  bVar1 = GetBootstrapBasename(options,basename,&bootstrap_basename);
  if (bVar1) {
    if (!bootstrap_flag) {
      std::__cxx11::string::string((string *)&forward_to_basename,(string *)&bootstrap_basename);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     basename,".pb.h");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
      pZVar3 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
      std::__cxx11::string::~string((string *)&printer);
      io::Printer::Printer(&printer,pZVar3,'$',(AnnotationCollector *)0x0);
      FilenameIdentifier(&sStack_128,basename);
      io::Printer::Print<char[20],std::__cxx11::string,char[20],std::__cxx11::string>
                (&printer,
                 "#ifndef PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n#define PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n#include \"$forward_to_basename$.pb.h\"  // IWYU pragma: export\n#endif  // PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n"
                 ,(char (*) [20])"forward_to_basename",&forward_to_basename,
                 (char (*) [20])"filename_identifier",&sStack_128);
      std::__cxx11::string::~string((string *)&sStack_128);
      if (options->opensource_runtime == false) {
        bVar1 = std::operator==(basename,"net/proto/protocoltype");
        if (bVar1) {
          io::Printer::Print<char[20],std::__cxx11::string>
                    (&printer,
                     "#ifdef SWIG\n%include \"$forward_to_basename$.pb.h\"\n#endif  // SWIG\n",
                     (char (*) [20])"forward_to_basename",&forward_to_basename);
        }
      }
      io::Printer::~Printer(&printer);
      if (pZVar3 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar3->_vptr_ZeroCopyOutputStream[1])(pZVar3);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     basename,".proto.h");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
      pZVar3 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar2);
      std::__cxx11::string::~string((string *)&printer);
      io::Printer::Printer(&printer,pZVar3,'$',(AnnotationCollector *)0x0);
      FilenameIdentifier(&sStack_128,basename);
      io::Printer::Print<char[20],std::__cxx11::string,char[20],std::__cxx11::string>
                (&printer,
                 "#ifndef PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n#define PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n#include \"$forward_to_basename$.proto.h\"  // IWYU pragma: export\n#endif  // PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n"
                 ,(char (*) [20])"forward_to_basename",&forward_to_basename,
                 (char (*) [20])"filename_identifier",&sStack_128);
      std::__cxx11::string::~string((string *)&sStack_128);
      io::Printer::~Printer(&printer);
      if (pZVar3 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar3->_vptr_ZeroCopyOutputStream[1])(pZVar3);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     basename,".pb.cc");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
      pZVar3 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar2);
      std::__cxx11::string::~string((string *)&printer);
      io::Printer::Printer(&printer,pZVar3,'$',(AnnotationCollector *)0x0);
      io::Printer::Print<>(&printer,"\n");
      io::Printer::~Printer(&printer);
      if (pZVar3 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar3->_vptr_ZeroCopyOutputStream[1])(pZVar3);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     basename,".pb.h.meta");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
      plVar4 = (long *)CONCAT44(extraout_var_02,iVar2);
      std::__cxx11::string::~string((string *)&printer);
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))(plVar4);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     basename,".proto.h.meta");
      iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&printer);
      plVar4 = (long *)CONCAT44(extraout_var_03,iVar2);
      std::__cxx11::string::~string((string *)&printer);
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))(plVar4);
      }
      std::__cxx11::string::~string((string *)&forward_to_basename);
      bVar1 = true;
      goto LAB_0028ad8c;
    }
    std::__cxx11::string::_M_assign((string *)basename);
  }
  bVar1 = false;
LAB_0028ad8c:
  std::__cxx11::string::~string((string *)&bootstrap_basename);
  return bVar1;
}

Assistant:

bool MaybeBootstrap(const Options& options, GeneratorContext* generator_context,
                    bool bootstrap_flag, std::string* basename) {
  std::string bootstrap_basename;
  if (!GetBootstrapBasename(options, *basename, &bootstrap_basename)) {
    return false;
  }

  if (bootstrap_flag) {
    // Adjust basename, but don't abort code generation.
    *basename = bootstrap_basename;
    return false;
  } else {
    std::string forward_to_basename = bootstrap_basename;

    // Generate forwarding headers and empty .pb.cc.
    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(*basename + ".pb.h"));
      io::Printer printer(output.get(), '$', nullptr);
      printer.Print(
          "#ifndef PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n"
          "#define PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n"
          "#include \"$forward_to_basename$.pb.h\"  // IWYU pragma: export\n"
          "#endif  // PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PB_H\n",
          "forward_to_basename", forward_to_basename, "filename_identifier",
          FilenameIdentifier(*basename));

      if (!options.opensource_runtime) {
        // HACK HACK HACK, tech debt from the deeps of proto1 and SWIG
        // protocoltype is SWIG'ed and we need to forward
        if (*basename == "net/proto/protocoltype") {
          printer.Print(
              "#ifdef SWIG\n"
              "%include \"$forward_to_basename$.pb.h\"\n"
              "#endif  // SWIG\n",
              "forward_to_basename", forward_to_basename);
        }
      }
    }

    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(*basename + ".proto.h"));
      io::Printer printer(output.get(), '$', nullptr);
      printer.Print(
          "#ifndef PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n"
          "#define PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n"
          "#include \"$forward_to_basename$.proto.h\"  // IWYU pragma: "
          "export\n"
          "#endif  // "
          "PROTOBUF_INCLUDED_$filename_identifier$_FORWARD_PROTO_H\n",
          "forward_to_basename", forward_to_basename, "filename_identifier",
          FilenameIdentifier(*basename));
    }

    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(*basename + ".pb.cc"));
      io::Printer printer(output.get(), '$', nullptr);
      printer.Print("\n");
    }

    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(*basename + ".pb.h.meta"));
    }

    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(*basename + ".proto.h.meta"));
    }

    // Abort code generation.
    return true;
  }
}